

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O2

BOOL SetEnvironmentVariableW(LPCWSTR lpName,LPCWSTR lpValue)

{
  DWORD DVar1;
  int iVar2;
  BOOL BVar3;
  LPCSTR lpMultiByteStr;
  LPSTR lpMultiByteStr_00;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0032ea71;
  iVar2 = WideCharToMultiByte(0,0,lpName,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
  if (iVar2 == 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032ea71;
    DVar1 = 0x57;
LAB_0032e9aa:
    SetLastError(DVar1);
    lpMultiByteStr = (LPCSTR)0x0;
LAB_0032e9b2:
    lpMultiByteStr_00 = (LPSTR)0x0;
    BVar3 = 0;
  }
  else {
    lpMultiByteStr = (LPCSTR)PAL_malloc((long)iVar2);
    if (lpMultiByteStr == (LPCSTR)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032ea71;
      DVar1 = 8;
      goto LAB_0032e9aa;
    }
    BVar3 = 0;
    iVar2 = WideCharToMultiByte(0,0,lpName,-1,lpMultiByteStr,iVar2,(LPCSTR)0x0,(LPBOOL)0x0);
    if (iVar2 != 0) {
      if (lpValue == (LPCWSTR)0x0) {
        lpMultiByteStr_00 = (LPCSTR)0x0;
LAB_0032ea09:
        BVar3 = SetEnvironmentVariableA(lpMultiByteStr,lpMultiByteStr_00);
        goto LAB_0032ea1e;
      }
      iVar2 = WideCharToMultiByte(0,0,lpValue,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
      if (iVar2 == 0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032ea71;
        DVar1 = 0x57;
      }
      else {
        lpMultiByteStr_00 = (LPSTR)PAL_malloc((long)iVar2);
        if (lpMultiByteStr_00 != (LPSTR)0x0) {
          BVar3 = 0;
          iVar2 = WideCharToMultiByte(0,0,lpValue,-1,lpMultiByteStr_00,iVar2,(LPCSTR)0x0,(LPBOOL)0x0
                                     );
          if (iVar2 == 0) {
            fprintf(_stderr,"] %s %s:%d","SetEnvironmentVariableW",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/environ.cpp"
                    ,0x13e);
            fprintf(_stderr,"WideCharToMultiByte failed\n");
            SetLastError(0x54f);
            goto LAB_0032ea1e;
          }
          goto LAB_0032ea09;
        }
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_0032ea71;
        DVar1 = 8;
      }
      SetLastError(DVar1);
      goto LAB_0032e9b2;
    }
    fprintf(_stderr,"] %s %s:%d","SetEnvironmentVariableW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/environ.cpp"
            ,0x123);
    fprintf(_stderr,"WideCharToMultiByte returned 0\n");
    SetLastError(0x54f);
    lpMultiByteStr_00 = (LPSTR)0x0;
  }
LAB_0032ea1e:
  PAL_free(lpMultiByteStr_00);
  PAL_free(lpMultiByteStr);
  if (PAL_InitializeChakraCoreCalled != false) {
    return BVar3;
  }
LAB_0032ea71:
  abort();
}

Assistant:

BOOL
PALAPI
SetEnvironmentVariableW(
            IN LPCWSTR lpName,
            IN LPCWSTR lpValue)
{
    PCHAR name = NULL;
    PCHAR value = NULL;
    INT nameSize = 0;
    INT valueSize = 0;
    BOOL bRet = FALSE;

    PERF_ENTRY(SetEnvironmentVariableW);
    ENTRY("SetEnvironmentVariableW(lpName=%p (%S), lpValue=%p (%S))\n",
        lpName?lpName:W16_NULLSTRING,
        lpName?lpName:W16_NULLSTRING, lpValue?lpValue:W16_NULLSTRING, lpValue?lpValue:W16_NULLSTRING);

    if ((nameSize = WideCharToMultiByte(CP_ACP, 0, lpName, -1, name, 0, 
                                        NULL, NULL)) == 0)
    {
        ERROR("WideCharToMultiByte failed\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    name = (PCHAR)PAL_malloc(sizeof(CHAR)* nameSize);
    if (name == NULL)
    {
        ERROR("malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    
    if ( 0 == WideCharToMultiByte(CP_ACP, 0, lpName,  -1, 
                                  name,  nameSize, NULL, NULL ) )
    {
        ASSERT( "WideCharToMultiByte returned 0\n" );
        SetLastError( ERROR_INTERNAL_ERROR );
        goto done;
    }

    if ( NULL != lpValue )
    {
        if ((valueSize = WideCharToMultiByte(CP_ACP, 0, lpValue, -1, value, 
                                             0, NULL, NULL)) == 0)
        {
            ERROR("WideCharToMultiByte failed\n");
            SetLastError(ERROR_INVALID_PARAMETER);
            goto done;
        }

        value = (PCHAR)PAL_malloc(sizeof(CHAR)*valueSize);
        
        if ( NULL == value )
        {
            ERROR("malloc failed\n");
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto done;
        }
        
        if ( 0 == WideCharToMultiByte( CP_ACP, 0, lpValue, -1, 
                                       value, valueSize, NULL, NULL ) )
        {
            ASSERT("WideCharToMultiByte failed\n");
            SetLastError( ERROR_INTERNAL_ERROR );
            goto done;
        }
    }
    

    bRet = SetEnvironmentVariableA(name, value);
done:
    PAL_free(value);
    PAL_free(name);
    
    LOGEXIT("SetEnvironmentVariableW returning BOOL %d\n", bRet);
    PERF_EXIT(SetEnvironmentVariableW);
    return bRet;
}